

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

Real __thiscall PeleLM::adjust_p_and_divu_for_closed_chamber(PeleLM *this,MultiFab *mac_divu)

{
  StateData *this_00;
  FabArray<amrex::FArrayBox> *pFVar1;
  double dVar2;
  undefined1 auVar3 [16];
  Real RVar4;
  Real RVar5;
  double dVar6;
  Real RVar7;
  Real RVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Real RVar13;
  Real RVar14;
  Real RVar15;
  Real RVar16;
  Real RVar17;
  Real RVar18;
  Real RVar19;
  PeleLM *this_01;
  FabArray<amrex::FArrayBox> *this_02;
  long lVar20;
  double *pdVar21;
  ostream *os_;
  Print *pPVar22;
  int n;
  double *pdVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int i;
  long lVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar44;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double *local_808;
  double *local_800;
  double *local_7f8;
  double *local_7f0;
  Real y [9];
  Real cpor [9];
  undefined1 local_708 [32];
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined1 *local_6c8;
  PeleLM *local_6b8;
  FabArray<amrex::FArrayBox> *local_6b0;
  FabArray<amrex::FArrayBox> *local_6a8;
  long local_6a0;
  long local_698;
  double *local_690;
  long local_688;
  long local_680;
  double *local_678;
  long local_670;
  long local_668;
  double *local_660;
  long local_658;
  long local_650;
  long local_648;
  long local_640;
  long local_638;
  long local_630;
  long local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608;
  double *local_600;
  double *local_5f8;
  double *local_5f0;
  ulong local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  Box local_5c4;
  double local_5a8;
  double dStack_5a0;
  Real tresult [9];
  Array4<const_double> local_478;
  Array4<const_double> local_438;
  Array4<double> local_3f8;
  Array4<const_double> local_3b8;
  Array4<const_double> local_378;
  MFIter mfi;
  MultiFab theta_halft;
  
  this_00 = (this->super_NavierStokesBase).super_AmrLevel.state.
            super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
            super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_6a8 = &((this_00->new_data)._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
               super_FabArray<amrex::FArrayBox>;
  pFVar1 = &((this_00->old_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
            super_FabArray<amrex::FArrayBox>;
  RVar4 = amrex::StateData::prevTime(this_00);
  RVar5 = amrex::StateData::curTime
                    ((this->super_NavierStokesBase).super_AmrLevel.state.
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl
                     .super__Vector_impl_data._M_start);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  cpor[0] = (Real)&PTR__FabFactory_006d8928;
  amrex::MultiFab::MultiFab
            (&theta_halft,&(this->super_NavierStokesBase).super_AmrLevel.grids,
             &(this->super_NavierStokesBase).super_AmrLevel.dmap,1,nGrowAdvForcing,(MFInfo *)&mfi,
             (FabFactory<amrex::FArrayBox> *)cpor);
  local_6b8 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::MFIter::MFIter(&mfi,&pFVar1->super_FabArrayBase,true);
  local_6b0 = pFVar1;
  while( true ) {
    pFVar1 = local_6b0;
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_5c4,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_438,pFVar1,&mfi,first_spec);
    this_02 = local_6a8;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_478,local_6a8,&mfi,first_spec);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_378,pFVar1,&mfi,NavierStokesBase::Temp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_3b8,this_02,&mfi,NavierStokesBase::Temp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_3f8,&theta_halft.super_FabArray<amrex::FArrayBox>,&mfi);
    local_658 = (long)local_5c4.smallend.vect[1];
    lVar20 = (long)local_5c4.smallend.vect[2];
    local_660 = local_378.p;
    local_5d8 = local_438.jstride * 8;
    local_648 = local_438.kstride * 8;
    lVar26 = (long)local_5c4.smallend.vect[0];
    local_608 = local_378.jstride;
    local_5e0 = local_478.jstride * 8;
    local_650 = local_478.kstride * 8;
    local_668 = local_378.kstride;
    auVar3._8_4_ = SUB84(p_amb_new,0);
    auVar3._0_8_ = p_amb_old;
    auVar3._12_4_ = (int)((ulong)p_amb_new >> 0x20);
    local_800 = (double *)
                ((lVar20 - local_438.begin.z) * local_648 +
                 (local_658 - local_438.begin.y) * local_5d8 + lVar26 * 8 +
                 (long)local_438.begin.x * -8 + (long)local_438.p);
    local_808 = (double *)
                ((lVar20 - local_478.begin.z) * local_650 +
                 (local_658 - local_478.begin.y) * local_5e0 + lVar26 * 8 +
                 (long)local_478.begin.x * -8 + (long)local_478.p);
    local_610 = (long)local_378.begin.y;
    local_670 = (long)local_378.begin.z;
    local_678 = local_3b8.p;
    local_618 = local_3b8.jstride;
    local_680 = local_3b8.kstride;
    local_620 = (long)local_3b8.begin.y;
    local_688 = (long)local_3b8.begin.z;
    local_690 = local_3f8.p;
    local_628 = local_3f8.jstride;
    local_698 = local_3f8.kstride;
    local_630 = (long)local_3f8.begin.y;
    local_6a0 = (long)local_3f8.begin.z;
    local_5e8 = (ulong)(uint)local_5c4.bigend.vect[0];
    local_5d0 = (long)local_5c4.bigend.vect[1];
    local_640 = (long)local_5c4.bigend.vect[2];
    while (lVar25 = lVar20, lVar25 <= local_640) {
      local_5f0 = local_378.p + (lVar25 - local_670) * local_378.kstride;
      local_5f8 = local_3b8.p + (lVar25 - local_688) * local_3b8.kstride;
      local_600 = local_3f8.p + (lVar25 - local_6a0) * local_3f8.kstride;
      local_7f0 = local_808;
      local_7f8 = local_800;
      for (lVar20 = local_658; lVar20 <= local_5d0; lVar20 = lVar20 + 1) {
        if (local_5c4.smallend.vect[0] <= local_5c4.bigend.vect[0]) {
          pdVar21 = local_7f8;
          pdVar29 = local_7f0;
          lVar31 = lVar26;
          do {
            dVar33 = 0.0;
            pdVar23 = pdVar21;
            lVar27 = 9;
            while (bVar32 = lVar27 != 0, lVar27 = lVar27 + -1, bVar32) {
              dVar33 = dVar33 + *pdVar23;
              pdVar23 = pdVar23 + local_438.nstride;
            }
            y[6] = 0.0;
            y[7] = 0.0;
            y[4] = 0.0;
            y[5] = 0.0;
            y[8] = 0.0;
            y[2] = 0.0;
            y[3] = 0.0;
            y[0] = 0.0;
            y[1] = 0.0;
            pdVar23 = pdVar21;
            for (lVar27 = 0; RVar19 = y[8], RVar18 = y[7], RVar17 = y[6], RVar16 = y[5],
                RVar15 = y[4], RVar14 = y[3], RVar13 = y[2], RVar8 = y[1], RVar7 = y[0], lVar27 != 9
                ; lVar27 = lVar27 + 1) {
              y[lVar27] = *pdVar23 * (1.0 / dVar33);
              pdVar23 = pdVar23 + local_438.nstride;
            }
            dVar33 = local_5f0[(lVar20 - local_610) * local_378.jstride +
                               (lVar31 - local_378.begin.x)];
            dVar51 = dVar33 * dVar33;
            dVar55 = dVar33 * dVar51;
            dVar54 = dVar33 * dVar55;
            local_708._0_4_ = -0x10410410;
            local_708._4_4_ = 0x3fdfbefb;
            local_708._8_4_ = -0x75bc4074;
            local_708._12_4_ = 0x3fa00041;
            local_708._16_4_ = -0xa963427;
            local_708._20_4_ = 0x3fac6bb6;
            local_708._24_8_ = 0x3fefbefbefbefbf0;
            local_6e8 = 0x3fb000418a43bf8c;
            uStack_6e0 = 0x3fae1af1b70e12fe;
            local_6d8 = 0x3f9f065042c3dbd3;
            uStack_6d0 = 0x3f9e1af1b70e12fe;
            local_6c8 = &DAT_3fa246cdaf410bdd;
            if (1000.0 <= dVar33) {
              cpor[0] = dVar54 * 1.58275179e-15 +
                        dVar55 * -9.23157818e-12 +
                        dVar51 * -5.63382869e-08 + dVar33 * 0.000700064411 + 2.99142337;
              cpor[1] = dVar54 * -1.13643531e-15 +
                        dVar55 * 1.77528148e-11 +
                        dVar51 * -1.25884199e-07 + dVar33 * 0.000613519689 + 3.69757819;
              cpor[4] = dVar54 * -4.3680515e-16 +
                        dVar55 * 4.55106742e-12 +
                        dVar51 * -3.10280335e-09 + dVar33 * -2.75506191e-05 + 2.54205966;
              cpor[5] = dVar54 * -1.33195876e-15 +
                        dVar55 * 3.05218674e-11 +
                        dVar51 * -2.59082758e-07 + dVar33 * 0.00105650448 + 2.86472886;
              cpor[6] = dVar54 * -1.07908535e-14 +
                        dVar55 * 1.1424637e-10 +
                        dVar51 * -6.3365815e-07 + dVar33 * 0.00223982013 + 4.0172109;
              cpor[7] = dVar54 * -1.43165356e-14 +
                        dVar55 * 2.34890357e-10 +
                        dVar51 * -1.47468882e-06 + dVar33 * 0.00433613639 + 4.57316685;
              dVar46 = dVar55 * 1.20099639e-10 +
                       dVar51 * -8.73026011e-07 + dVar33 * 0.00305629289 + 2.67214561;
              dVar48 = dVar55 * 1.009704e-10 +
                       dVar51 * -5.684761e-07 + dVar33 * 0.001487977 + 2.92664;
              dVar40 = -6.39161787e-15;
              dVar2 = -6.753351e-15;
            }
            else {
              cpor[0] = dVar54 * 4.13487224e-13 +
                        dVar55 * -9.47543433e-11 +
                        dVar51 * -8.14301529e-07 + dVar33 * 0.000824944174 + 3.29812431;
              cpor[1] = dVar54 * -8.76855392e-13 +
                        dVar55 * 1.31387723e-09 +
                        dVar51 * -5.75615047e-07 + dVar33 * 0.00112748635 + 3.2129364;
              cpor[4] = dVar54 * 3.89069636e-13 +
                        dVar55 * -1.60284319e-09 +
                        dVar51 * 2.4210317e-06 + dVar33 * -0.00163816649 + 2.94642878;
              cpor[5] = dVar54 * 2.06237379e-12 +
                        dVar55 * -5.79853643e-09 +
                        dVar51 * 6.52764691e-06 + dVar33 * -0.00322544939 + 4.12530561;
              cpor[6] = dVar54 * 9.29225124e-12 +
                        dVar55 * -2.42763894e-08 +
                        dVar51 * 2.11582891e-05 + dVar33 * -0.00474912051 + 4.30179801;
              cpor[7] = dVar54 * 2.47151475e-12 +
                        dVar55 * -4.62580552e-09 +
                        dVar51 * -1.48501258e-07 + dVar33 * 0.00656922581 + 3.38875365;
              dVar46 = dVar55 * 6.96858127e-09 +
                       dVar51 * -6.35469633e-06 + dVar33 * 0.00347498246 + 3.38684249;
              dVar48 = dVar55 * 5.641515e-09 +
                       dVar51 * -3.963222e-06 + dVar33 * 0.00140824 + 3.298677;
              dVar40 = -2.50658847e-12;
              dVar2 = -2.444855e-12;
            }
            cpor[2] = dVar54 * dVar40 + dVar46;
            cpor[3] = dVar54 * 0.0 + dVar55 * 0.0 + dVar51 * 0.0 + dVar33 * 0.0 + 2.5;
            cpor[8] = dVar54 * dVar2 + dVar48;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              tresult[lVar27] = cpor[lVar27] * y[lVar27] * *(double *)(local_708 + lVar27 * 8);
            }
            dVar40 = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              dVar40 = dVar40 + tresult[lVar27];
            }
            if (1000.0 <= dVar33) {
              dVar48 = dVar55 * -9.23157818e-12 +
                       dVar51 * -5.63382869e-08 + dVar33 * 0.000700064411 + 1.99142337;
              dVar9 = dVar55 * 1.77528148e-11 +
                      dVar51 * -1.25884199e-07 + dVar33 * 0.000613519689 + 2.69757819;
              dVar41 = dVar54 * -1.43165356e-14 +
                       dVar55 * 2.34890357e-10 +
                       dVar51 * -1.47468882e-06 + dVar33 * 0.00433613639 + 3.57316685;
              dVar44 = dVar54 * -6.753351e-15 +
                       dVar55 * 1.009704e-10 +
                       dVar51 * -5.684761e-07 + dVar33 * 0.001487977 + 1.92664;
              local_5a8 = dVar54 * -1.33195876e-15 +
                          dVar55 * 3.05218674e-11 +
                          dVar51 * -2.59082758e-07 + dVar33 * 0.00105650448 + 1.86472886;
              dStack_5a0 = dVar54 * -1.07908535e-14 +
                           dVar55 * 1.1424637e-10 +
                           dVar51 * -6.3365815e-07 + dVar33 * 0.00223982013 + 3.0172109;
              dVar47 = dVar54 * -6.39161787e-15 +
                       dVar55 * 1.20099639e-10 +
                       dVar51 * -8.73026011e-07 + dVar33 * 0.00305629289 + 1.67214561;
              dVar49 = dVar54 * -4.3680515e-16 +
                       dVar55 * 4.55106742e-12 +
                       dVar51 * -3.10280335e-09 + dVar33 * -2.75506191e-05 + 1.54205966;
              dVar2 = 1.58275179e-15;
              dVar46 = -1.13643531e-15;
            }
            else {
              dVar48 = dVar55 * -9.47543433e-11 +
                       dVar51 * -8.14301529e-07 + dVar33 * 0.000824944174 + 2.29812431;
              dVar9 = dVar55 * 1.31387723e-09 +
                      dVar51 * -5.75615047e-07 + dVar33 * 0.00112748635 + 2.2129364;
              dVar41 = dVar54 * 2.47151475e-12 +
                       dVar55 * -4.62580552e-09 +
                       dVar51 * -1.48501258e-07 + dVar33 * 0.00656922581 + 2.38875365;
              dVar44 = dVar54 * -2.444855e-12 +
                       dVar55 * 5.641515e-09 +
                       dVar51 * -3.963222e-06 + dVar33 * 0.00140824 + 2.298677;
              local_5a8 = dVar54 * 2.06237379e-12 +
                          dVar55 * -5.79853643e-09 +
                          dVar51 * 6.52764691e-06 + dVar33 * -0.00322544939 + 3.12530561;
              dStack_5a0 = dVar54 * 9.29225124e-12 +
                           dVar55 * -2.42763894e-08 +
                           dVar51 * 2.11582891e-05 + dVar33 * -0.00474912051 + 3.30179801;
              dVar47 = dVar54 * -2.50658847e-12 +
                       dVar55 * 6.96858127e-09 +
                       dVar51 * -6.35469633e-06 + dVar33 * 0.00347498246 + 2.38684249;
              dVar49 = dVar54 * 3.89069636e-13 +
                       dVar55 * -1.60284319e-09 +
                       dVar51 * 2.4210317e-06 + dVar33 * -0.00163816649 + 1.94642878;
              dVar2 = 4.13487224e-13;
              dVar46 = -8.76855392e-13;
            }
            dVar34 = 0.0;
            pdVar23 = pdVar29;
            lVar27 = 9;
            while (bVar32 = lVar27 != 0, lVar27 = lVar27 + -1, bVar32) {
              dVar34 = dVar34 + *pdVar23;
              pdVar23 = pdVar23 + local_478.nstride;
            }
            y[6] = 0.0;
            y[7] = 0.0;
            y[4] = 0.0;
            y[5] = 0.0;
            y[8] = 0.0;
            y[2] = 0.0;
            y[3] = 0.0;
            y[0] = 0.0;
            y[1] = 0.0;
            pdVar23 = pdVar29;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              y[lVar27] = *pdVar23 * (1.0 / dVar34);
              pdVar23 = pdVar23 + local_478.nstride;
            }
            dVar34 = local_5f8[(lVar20 - local_620) * local_3b8.jstride +
                               (lVar31 - local_3b8.begin.x)];
            dVar56 = dVar34 * dVar34;
            dVar45 = dVar34 * dVar56;
            dVar39 = dVar34 * dVar45;
            local_708._0_4_ = -0x10410410;
            local_708._4_4_ = 0x3fdfbefb;
            local_708._8_4_ = -0x75bc4074;
            local_708._12_4_ = 0x3fa00041;
            local_708._16_4_ = -0xa963427;
            local_708._20_4_ = 0x3fac6bb6;
            local_708._24_8_ = 0x3fefbefbefbefbf0;
            local_6e8 = 0x3fb000418a43bf8c;
            uStack_6e0 = 0x3fae1af1b70e12fe;
            local_6d8 = 0x3f9f065042c3dbd3;
            uStack_6d0 = 0x3f9e1af1b70e12fe;
            local_6c8 = &DAT_3fa246cdaf410bdd;
            if (1000.0 <= dVar34) {
              cpor[0] = dVar39 * 1.58275179e-15 +
                        dVar45 * -9.23157818e-12 +
                        dVar56 * -5.63382869e-08 + dVar34 * 0.000700064411 + 2.99142337;
              cpor[1] = dVar39 * -1.13643531e-15 +
                        dVar45 * 1.77528148e-11 +
                        dVar56 * -1.25884199e-07 + dVar34 * 0.000613519689 + 3.69757819;
              cpor[4] = dVar39 * -4.3680515e-16 +
                        dVar45 * 4.55106742e-12 +
                        dVar56 * -3.10280335e-09 + dVar34 * -2.75506191e-05 + 2.54205966;
              cpor[5] = dVar39 * -1.33195876e-15 +
                        dVar45 * 3.05218674e-11 +
                        dVar56 * -2.59082758e-07 + dVar34 * 0.00105650448 + 2.86472886;
              cpor[6] = dVar39 * -1.07908535e-14 +
                        dVar45 * 1.1424637e-10 +
                        dVar56 * -6.3365815e-07 + dVar34 * 0.00223982013 + 4.0172109;
              cpor[7] = dVar39 * -1.43165356e-14 +
                        dVar45 * 2.34890357e-10 +
                        dVar56 * -1.47468882e-06 + dVar34 * 0.00433613639 + 4.57316685;
              cpor[2] = dVar39 * -6.39161787e-15 +
                        dVar45 * 1.20099639e-10 +
                        dVar56 * -8.73026011e-07 + dVar34 * 0.00305629289 + 2.67214561;
              cpor[8] = dVar39 * -6.753351e-15 +
                        dVar45 * 1.009704e-10 +
                        dVar56 * -5.684761e-07 + dVar34 * 0.001487977 + 2.92664;
            }
            else {
              cpor[0] = dVar39 * 4.13487224e-13 +
                        dVar45 * -9.47543433e-11 +
                        dVar56 * -8.14301529e-07 + dVar34 * 0.000824944174 + 3.29812431;
              cpor[1] = dVar39 * -8.76855392e-13 +
                        dVar45 * 1.31387723e-09 +
                        dVar56 * -5.75615047e-07 + dVar34 * 0.00112748635 + 3.2129364;
              cpor[4] = dVar39 * 3.89069636e-13 +
                        dVar45 * -1.60284319e-09 +
                        dVar56 * 2.4210317e-06 + dVar34 * -0.00163816649 + 2.94642878;
              cpor[5] = dVar39 * 2.06237379e-12 +
                        dVar45 * -5.79853643e-09 +
                        dVar56 * 6.52764691e-06 + dVar34 * -0.00322544939 + 4.12530561;
              cpor[6] = dVar39 * 9.29225124e-12 +
                        dVar45 * -2.42763894e-08 +
                        dVar56 * 2.11582891e-05 + dVar34 * -0.00474912051 + 4.30179801;
              cpor[7] = dVar39 * 2.47151475e-12 +
                        dVar45 * -4.62580552e-09 +
                        dVar56 * -1.48501258e-07 + dVar34 * 0.00656922581 + 3.38875365;
              cpor[2] = dVar39 * -2.50658847e-12 +
                        dVar45 * 6.96858127e-09 +
                        dVar56 * -6.35469633e-06 + dVar34 * 0.00347498246 + 3.38684249;
              cpor[8] = dVar39 * -2.444855e-12 +
                        dVar45 * 5.641515e-09 +
                        dVar56 * -3.963222e-06 + dVar34 * 0.00140824 + 3.298677;
            }
            cpor[3] = dVar39 * 0.0 + dVar45 * 0.0 + dVar56 * 0.0 + dVar34 * 0.0 + 2.5;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              tresult[lVar27] = cpor[lVar27] * y[lVar27] * *(double *)(local_708 + lVar27 * 8);
            }
            dVar50 = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              dVar50 = dVar50 + tresult[lVar27];
            }
            if (1000.0 <= dVar34) {
              dVar6 = dVar45 * -9.23157818e-12 +
                      dVar56 * -5.63382869e-08 + dVar34 * 0.000700064411 + 1.99142337;
              dVar10 = dVar45 * 1.77528148e-11 +
                       dVar56 * -1.25884199e-07 + dVar34 * 0.000613519689 + 2.69757819;
              dVar52 = dVar39 * -1.43165356e-14 +
                       dVar45 * 2.34890357e-10 +
                       dVar56 * -1.47468882e-06 + dVar34 * 0.00433613639 + 3.57316685;
              dVar53 = dVar39 * -6.753351e-15 +
                       dVar45 * 1.009704e-10 +
                       dVar56 * -5.684761e-07 + dVar34 * 0.001487977 + 1.92664;
              dVar35 = dVar39 * -1.33195876e-15 +
                       dVar45 * 3.05218674e-11 +
                       dVar56 * -2.59082758e-07 + dVar34 * 0.00105650448 + 1.86472886;
              dVar36 = dVar39 * -1.07908535e-14 +
                       dVar45 * 1.1424637e-10 +
                       dVar56 * -6.3365815e-07 + dVar34 * 0.00223982013 + 3.0172109;
              dVar37 = dVar39 * -6.39161787e-15 +
                       dVar45 * 1.20099639e-10 +
                       dVar56 * -8.73026011e-07 + dVar34 * 0.00305629289 + 1.67214561;
              dVar38 = dVar39 * -4.3680515e-16 +
                       dVar45 * 4.55106742e-12 +
                       dVar56 * -3.10280335e-09 + dVar34 * -2.75506191e-05 + 1.54205966;
              dVar11 = 1.58275179e-15;
              dVar12 = -1.13643531e-15;
            }
            else {
              dVar6 = dVar45 * -9.47543433e-11 +
                      dVar56 * -8.14301529e-07 + dVar34 * 0.000824944174 + 2.29812431;
              dVar10 = dVar45 * 1.31387723e-09 +
                       dVar56 * -5.75615047e-07 + dVar34 * 0.00112748635 + 2.2129364;
              dVar52 = dVar39 * 2.47151475e-12 +
                       dVar45 * -4.62580552e-09 +
                       dVar56 * -1.48501258e-07 + dVar34 * 0.00656922581 + 2.38875365;
              dVar53 = dVar39 * -2.444855e-12 +
                       dVar45 * 5.641515e-09 +
                       dVar56 * -3.963222e-06 + dVar34 * 0.00140824 + 2.298677;
              dVar35 = dVar39 * 2.06237379e-12 +
                       dVar45 * -5.79853643e-09 +
                       dVar56 * 6.52764691e-06 + dVar34 * -0.00322544939 + 3.12530561;
              dVar36 = dVar39 * 9.29225124e-12 +
                       dVar45 * -2.42763894e-08 +
                       dVar56 * 2.11582891e-05 + dVar34 * -0.00474912051 + 3.30179801;
              dVar37 = dVar39 * -2.50658847e-12 +
                       dVar45 * 6.96858127e-09 +
                       dVar56 * -6.35469633e-06 + dVar34 * 0.00347498246 + 2.38684249;
              dVar38 = dVar39 * 3.89069636e-13 +
                       dVar45 * -1.60284319e-09 +
                       dVar56 * 2.4210317e-06 + dVar34 * -0.00163816649 + 1.94642878;
              dVar11 = 4.13487224e-13;
              dVar12 = -8.76855392e-13;
            }
            auVar42._0_8_ =
                 (dVar44 * RVar19 * 0.03569643749553795 +
                 dVar41 * RVar18 * 0.029399658963956014 +
                 dStack_5a0 * RVar17 * 0.030297521662727988 +
                 local_5a8 * RVar16 * 0.05879931792791203 +
                 dVar49 * RVar15 * 0.06250390649415588 +
                 (dVar54 * 0.0 + dVar55 * 0.0 + dVar51 * 0.0 + dVar33 * 0.0 + 1.5) * RVar14 *
                 0.9920634920634921 +
                 dVar47 * RVar13 * 0.055509297807382736 +
                 (dVar54 * dVar46 + dVar9) * RVar8 * 0.03125195324707794 +
                 RVar7 * (dVar54 * dVar2 + dVar48) * 0.49603174603174605 + 0.0) * 83144626.1815324;
            auVar42._8_8_ =
                 (dVar53 * y[8] * 0.03569643749553795 +
                 dVar52 * y[7] * 0.029399658963956014 +
                 dVar36 * y[6] * 0.030297521662727988 +
                 dVar35 * y[5] * 0.05879931792791203 +
                 dVar38 * y[4] * 0.06250390649415588 +
                 (dVar39 * 0.0 + dVar45 * 0.0 + dVar56 * 0.0 + dVar34 * 0.0 + 1.5) * y[3] *
                 0.9920634920634921 +
                 dVar37 * y[2] * 0.055509297807382736 +
                 (dVar39 * dVar12 + dVar10) * y[1] * 0.03125195324707794 +
                 y[0] * (dVar39 * dVar11 + dVar6) * 0.49603174603174605 + 0.0) * 83144626.1815324;
            auVar43._8_8_ = dVar50 * 83144626.1815324;
            auVar43._0_8_ = dVar40 * 83144626.1815324;
            auVar43 = divpd(auVar42,auVar43);
            auVar43 = divpd(auVar43,auVar3);
            local_600[(lVar20 - local_630) * local_3f8.jstride + (lVar31 - local_3f8.begin.x)] =
                 (auVar43._8_8_ + auVar43._0_8_) * 0.5;
            lVar31 = lVar31 + 1;
            pdVar21 = pdVar21 + 1;
            pdVar29 = pdVar29 + 1;
          } while (local_5c4.bigend.vect[0] + 1U != (int)lVar31);
        }
        local_7f8 = local_7f8 + local_438.jstride;
        local_7f0 = local_7f0 + local_478.jstride;
      }
      local_800 = local_800 + local_438.kstride;
      local_808 = local_808 + local_478.kstride;
      local_638 = lVar25;
      lVar20 = lVar25 + 1;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  this_01 = local_6b8;
  RVar7 = getMFsum(local_6b8,mac_divu,0);
  RVar8 = getMFsum(this_01,&theta_halft,0);
  dVar33 = RVar7 / lev0cellCount;
  thetabar = RVar8 / lev0cellCount;
  amrex::MultiFab::plus(mac_divu,-dVar33,0,1,0);
  amrex::MultiFab::plus(&theta_halft,-thetabar,0,1,0);
  dp0dt = dVar33 / thetabar;
  p_amb_new = (RVar5 - RVar4) * dp0dt + p_amb_old;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)mac_divu,true);
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox((Box *)local_708,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)cpor,&mac_divu->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)tresult,&theta_halft.super_FabArray<amrex::FArrayBox>,&mfi);
    dVar51 = dVar33 / thetabar;
    lVar20 = (long)(int)local_708._4_4_;
    lVar25 = (long)(int)local_708._8_4_;
    lVar31 = (lVar20 - cpor[4]._4_4_) * (long)cpor[1] * 8 +
             (lVar25 - cpor[5]._0_4_) * (long)cpor[2] * 8 + (long)(int)local_708._0_4_ * 8 +
             (long)cpor[4]._0_4_ * -8 + (long)cpor[0];
    lVar26 = (lVar20 - tresult[4]._4_4_) * (long)tresult[1] * 8 +
             (lVar25 - tresult[5]._0_4_) * (long)tresult[2] * 8 + (long)(int)local_708._0_4_ * 8 +
             (long)tresult[4]._0_4_ * -8 + (long)tresult[0];
    for (; lVar27 = lVar20, lVar28 = lVar31, lVar30 = lVar26, lVar25 <= (int)local_708._20_4_;
        lVar25 = lVar25 + 1) {
      for (; lVar27 <= (int)local_708._16_4_; lVar27 = lVar27 + 1) {
        if ((int)local_708._0_4_ <= (int)local_708._12_4_) {
          lVar24 = 0;
          do {
            *(double *)(lVar28 + lVar24 * 8) =
                 *(double *)(lVar28 + lVar24 * 8) - *(double *)(lVar30 + lVar24 * 8) * dVar51;
            lVar24 = lVar24 + 1;
          } while ((local_708._12_4_ - local_708._0_4_) + 1 != (int)lVar24);
        }
        lVar28 = lVar28 + (long)cpor[1] * 8;
        lVar30 = lVar30 + (long)tresult[1] * 8;
      }
      lVar31 = lVar31 + (long)cpor[2] * 8;
      lVar26 = lVar26 + (long)tresult[2] * 8;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  if (NavierStokesBase::verbose != 0) {
    os_ = amrex::OutStream();
    amrex::Print::Print((Print *)&mfi,os_);
    std::operator<<((ostream *)&mfi.tile_size,"level 0: prev_time, p_amb_old, p_amb_new, delta = ");
    std::ostream::_M_insert<double>(RVar4);
    std::operator<<((ostream *)&mfi.tile_size," ");
    pPVar22 = amrex::Print::operator<<((Print *)&mfi,&p_amb_old);
    std::operator<<((ostream *)&pPVar22->ss," ");
    pPVar22 = amrex::Print::operator<<(pPVar22,&p_amb_new);
    std::operator<<((ostream *)&pPVar22->ss," ");
    std::ostream::_M_insert<double>(p_amb_new - p_amb_old);
    std::endl<char,std::char_traits<char>>((ostream *)&pPVar22->ss);
    amrex::Print::~Print((Print *)&mfi);
  }
  amrex::MultiFab::~MultiFab(&theta_halft);
  return dVar33;
}

Assistant:

Real
PeleLM::adjust_p_and_divu_for_closed_chamber(MultiFab& mac_divu)
{
   const MultiFab& S_new = get_new_data(State_Type);
   const MultiFab& S_old = get_old_data(State_Type);

   const Real prev_time = state[State_Type].prevTime();
   const Real cur_time  = state[State_Type].curTime();
   const Real dt = cur_time - prev_time;

   // used for closed chamber algorithm
   MultiFab theta_halft(grids,dmap,1,nGrowAdvForcing);

   // compute old, new, and time-centered theta = 1 / (gamma P)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY_o  = S_old.const_array(mfi,first_spec);
      auto const& rhoY_n  = S_new.const_array(mfi,first_spec);
      auto const& T_o     = S_old.const_array(mfi,Temp);
      auto const& T_n     = S_new.const_array(mfi,Temp);
      auto const& theta   = theta_halft.array(mfi);
      amrex::Real pamb_o  = p_amb_old;
      amrex::Real pamb_n  = p_amb_new;

      amrex::ParallelFor(bx, [rhoY_o, rhoY_n, T_o, T_n, theta, pamb_o, pamb_n]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         amrex::Real gammaInv_o = getGammaInv( i, j, k, rhoY_o, T_o );
         amrex::Real gammaInv_n = getGammaInv( i, j, k, rhoY_n, T_n );
         theta(i,j,k) = 0.5 * ( gammaInv_o/pamb_o + gammaInv_n/pamb_n );
      });
   }

   // Get S sum and theta sum
   Real Ssum = getMFsum(mac_divu,0);
   Real thetasum = getMFsum(theta_halft,0);

   // Normalize by cell count / uncovered cell count if EB
   Real Sbar = Ssum/lev0cellCount;
   thetabar  = thetasum/lev0cellCount;

   // subtract mean from mac_divu and theta_nph
   mac_divu.plus(-Sbar,0,1);
   theta_halft.plus(-thetabar,0,1);

   p_amb_new = p_amb_old + dt*(Sbar/thetabar);
   dp0dt = Sbar/thetabar;

   // update mac rhs by adding delta_theta * (Sbar / thetabar)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(mac_divu,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& m_divu  = mac_divu.array(mfi);
      auto const& theta   = theta_halft.const_array(mfi);
      amrex::Real scaling = Sbar/thetabar;

      amrex::ParallelFor(bx, [m_divu, theta, scaling]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         m_divu(i,j,k) -= theta(i,j,k) * scaling;
      });
   }

   if (verbose) {
      amrex::Print() << "level 0: prev_time, p_amb_old, p_amb_new, delta = "
                     << prev_time << " " << p_amb_old << " " << p_amb_new << " "
                     << p_amb_new-p_amb_old << std::endl;
   }

   return Sbar;
}